

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O1

void __thiscall uWS::TopicTree::unsubscribeAll(TopicTree *this,Subscriber *subscriber)

{
  set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_> *this_00;
  Subscriber *pSVar1;
  Topic *topic;
  pair<std::_Rb_tree_iterator<uWS::Subscriber_*>,_std::_Rb_tree_iterator<uWS::Subscriber_*>_> pVar2;
  list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *local_38;
  
  if (subscriber != (Subscriber *)0x0) {
    local_38 = (list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_> *)subscriber;
    for (pSVar1 = *(Subscriber **)subscriber; pSVar1 != subscriber; pSVar1 = *(Subscriber **)pSVar1)
    {
      topic = *(Topic **)(pSVar1 + 0x10);
      this_00 = &topic->subs;
      pVar2 = std::
              _Rb_tree<uWS::Subscriber_*,_uWS::Subscriber_*,_std::_Identity<uWS::Subscriber_*>,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
              ::equal_range(&this_00->_M_t,(key_type *)&local_38);
      std::
      _Rb_tree<uWS::Subscriber_*,_uWS::Subscriber_*,_std::_Identity<uWS::Subscriber_*>,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
      trimTree(this,topic);
    }
    std::__cxx11::list<uWS::Topic_*,_std::allocator<uWS::Topic_*>_>::clear(local_38);
  }
  return;
}

Assistant:

void unsubscribeAll(Subscriber *subscriber) {
        if (subscriber) {
            for (Topic *topic : subscriber->subscriptions) {
                topic->subs.erase(subscriber);
                trimTree(topic);
            }
            subscriber->subscriptions.clear();
        }
    }